

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O2

void CodeAperiodicity(double **aperiodicity,int f0_length,int fs,int fft_size,
                     double **coded_aperiodicity)

{
  double *xi;
  double *y;
  ulong uVar1;
  uint xi_length;
  ulong uVar2;
  int j;
  uint x_length;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = (double)fs * 0.5 + -3000.0;
  dVar6 = 15000.0;
  if (dVar5 <= 15000.0) {
    dVar6 = dVar5;
  }
  xi_length = (uint)(dVar6 / 3000.0);
  uVar2 = (long)(int)xi_length * 8;
  if ((int)xi_length < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar3 = 0;
  if (0 < (int)xi_length) {
    uVar3 = (ulong)xi_length;
  }
  xi = (double *)operator_new__(uVar2);
  uVar2 = 0;
  while (uVar3 != uVar2) {
    xi[uVar2] = (double)(int)(uVar2 + 1) * 3000.0;
    uVar2 = uVar2 + 1;
  }
  x_length = fft_size / 2 + 1;
  uVar2 = (long)(fft_size / 2) * 8 + 8;
  if (fft_size < -3) {
    uVar2 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar2);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)x_length) {
    uVar2 = (ulong)x_length;
  }
  uVar1 = (ulong)(uint)f0_length;
  if (f0_length < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = log10(aperiodicity[uVar3][uVar4]);
      y[uVar4] = dVar6 * 20.0;
    }
    interp1Q(0.0,(double)fs / (double)fft_size,y,x_length,xi,xi_length,coded_aperiodicity[uVar3]);
  }
  operator_delete__(xi);
  operator_delete__(y);
  return;
}

Assistant:

void CodeAperiodicity(const double * const *aperiodicity, int f0_length,
    int fs, int fft_size, double **coded_aperiodicity) {
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *coarse_frequency_axis = new double[number_of_aperiodicities];
  for (int i = 0; i < number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = world::kFrequencyInterval * (i + 1.0);

  double *log_aperiodicity = new double[fft_size / 2 + 1];

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      log_aperiodicity[j] = 20 * log10(aperiodicity[i][j]);
    interp1Q(0, static_cast<double>(fs) / fft_size, log_aperiodicity,
        fft_size / 2 + 1, coarse_frequency_axis, number_of_aperiodicities,
        coded_aperiodicity[i]);
  }

  delete[] coarse_frequency_axis;
  delete[] log_aperiodicity;
}